

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sorted-usec-list.c
# Opt level: O3

int lws_sul_earliest_wakeable_event(lws_context *ctx,lws_usec_t *pearliest)

{
  int iVar1;
  int iVar2;
  ulong uVar3;
  uint32_t *puVar4;
  lws_dll2 *plVar5;
  
  iVar1 = 1;
  if ((ulong)ctx->count_threads != 0) {
    puVar4 = &ctx->pt[0].pt_sul_owner[1].count;
    iVar2 = -1;
    uVar3 = 0;
    plVar5 = (lws_dll2 *)0x0;
    do {
      if ((*puVar4 != 0) &&
         ((long)(*(lws_dll2 **)(puVar4 + -2))[1].prev < (long)plVar5 || iVar2 == -1)) {
        iVar2 = (int)uVar3;
        plVar5 = (*(lws_dll2 **)(puVar4 + -2))[1].prev;
      }
      uVar3 = uVar3 + 1;
      puVar4 = puVar4 + 0x68;
    } while (ctx->count_threads != uVar3);
    if (iVar2 != -1) {
      *pearliest = (lws_usec_t)plVar5;
      iVar1 = 0;
    }
  }
  return iVar1;
}

Assistant:

int
lws_sul_earliest_wakeable_event(struct lws_context *ctx, lws_usec_t *pearliest)
{
	struct lws_context_per_thread *pt;
	int n = 0, hit = -1;
	lws_usec_t lowest = 0;

	for (n = 0; n < ctx->count_threads; n++) {
		pt = &ctx->pt[n];

		lws_pt_lock(pt, __func__);

		if (pt->pt_sul_owner[LWSSULLI_WAKE_IF_SUSPENDED].count) {
			lws_sorted_usec_list_t *sul = (lws_sorted_usec_list_t *)
					lws_dll2_get_head(&pt->pt_sul_owner[
					           LWSSULLI_WAKE_IF_SUSPENDED]);

			if (hit == -1 || sul->us < lowest) {
				hit = n;
				lowest = sul->us;
			}
		}

		lws_pt_unlock(pt);
	}


	if (hit == -1)
		/* there is no pending event */
		return 1;

	*pearliest = lowest;

	return 0;
}